

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O1

Scalar * __thiscall
Eigen::SparseMatrix<double,_0,_int>::insertUncompressed
          (SparseMatrix<double,_0,_int> *this,Index row,Index col)

{
  int *piVar1;
  Scalar *pSVar2;
  int iVar3;
  int iVar4;
  StorageIndex *pSVar5;
  Scalar *pSVar6;
  StorageIndex *pSVar7;
  long lVar8;
  long lVar9;
  SingletonVector local_20;
  
  iVar3 = this->m_innerNonZeros[col];
  if (this->m_outerIndex[col + 1] - this->m_outerIndex[col] <= iVar3) {
    local_20.m_value = 2;
    if (2 < iVar3) {
      local_20.m_value = iVar3;
    }
    local_20.m_index = (StorageIndex)col;
    SparseMatrix<double,0,int>::
    reserveInnerVectors<Eigen::SparseMatrix<double,0,int>::SingletonVector>
              ((SparseMatrix<double,0,int> *)this,&local_20);
  }
  pSVar5 = this->m_innerNonZeros;
  iVar3 = this->m_outerIndex[col];
  lVar8 = (long)pSVar5[col];
  lVar9 = lVar8 + iVar3;
  if (0 < lVar8) {
    pSVar6 = (this->m_data).m_values;
    pSVar7 = (this->m_data).m_indices;
    lVar8 = lVar9;
    do {
      iVar4 = pSVar7[lVar8 + -1];
      lVar9 = lVar8;
      if (iVar4 <= (int)row) break;
      lVar9 = lVar8 + -1;
      pSVar7[lVar8] = iVar4;
      pSVar6[lVar8] = pSVar6[lVar8 + -1];
      lVar8 = lVar9;
    } while (iVar3 < lVar9);
  }
  piVar1 = pSVar5 + col;
  *piVar1 = *piVar1 + 1;
  (this->m_data).m_indices[lVar9] = (int)row;
  pSVar2 = (this->m_data).m_values + lVar9;
  *pSVar2 = 0.0;
  return pSVar2;
}

Assistant:

EIGEN_DONT_INLINE typename SparseMatrix<_Scalar,_Options,_StorageIndex>::Scalar& SparseMatrix<_Scalar,_Options,_StorageIndex>::insertUncompressed(Index row, Index col)
{
  eigen_assert(!isCompressed());

  const Index outer = IsRowMajor ? row : col;
  const StorageIndex inner = convert_index(IsRowMajor ? col : row);

  Index room = m_outerIndex[outer+1] - m_outerIndex[outer];
  StorageIndex innerNNZ = m_innerNonZeros[outer];
  if(innerNNZ>=room)
  {
    // this inner vector is full, we need to reallocate the whole buffer :(
    reserve(SingletonVector(outer,std::max<StorageIndex>(2,innerNNZ)));
  }

  Index startId = m_outerIndex[outer];
  Index p = startId + m_innerNonZeros[outer];
  while ( (p > startId) && (m_data.index(p-1) > inner) )
  {
    m_data.index(p) = m_data.index(p-1);
    m_data.value(p) = m_data.value(p-1);
    --p;
  }
  eigen_assert((p<=startId || m_data.index(p-1)!=inner) && "you cannot insert an element that already exists, you must call coeffRef to this end");

  m_innerNonZeros[outer]++;

  m_data.index(p) = inner;
  return (m_data.value(p) = Scalar(0));
}